

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnsweringCommentsMinigame.cpp
# Opt level: O3

void __thiscall AnsweringCommentsMinigame::start(AnsweringCommentsMinigame *this)

{
  float fVar1;
  float fVar2;
  
  this->titleFadeoutTimer = 0.0;
  fVar2 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&this->engine);
  fVar1 = (this->nextCommentDistrib)._M_param._M_a;
  this->nextCommentTimer = ((this->nextCommentDistrib)._M_param._M_b - fVar1) * fVar2 + fVar1;
  return;
}

Assistant:

void AnsweringCommentsMinigame::start() {
    titleFadeoutTimer = 0.0f;
    nextCommentTimer = nextCommentDistrib(engine);
}